

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::PrintImpl
          (Printer *this,string_view format,
          Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args,PrintOptions opts)

{
  pointer ppVar1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *ppVar2;
  char *data;
  pointer pcVar3;
  AnnotationCollector *pAVar4;
  pointer pfVar5;
  _anonymous_namespace_ *__n;
  iterator __position;
  pointer pfVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  pointer ppVar12;
  pointer pLVar13;
  bool bVar14;
  char cVar15;
  int iVar16;
  pointer pCVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined7 extraout_var;
  pointer prVar19;
  LogMessage *this_00;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  int *piVar20;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar21;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  int *extraout_RDX_10;
  undefined8 extraout_RDX_11;
  char *pcVar22;
  size_t size;
  char *pcVar23;
  long lVar24;
  char *pcVar25;
  undefined8 in_R9;
  char *pcVar26;
  ulong index;
  size_t sVar27;
  ulong uVar28;
  size_type __rlen;
  lts_20250127 *plVar29;
  ulong uVar30;
  char *pcVar31;
  size_t sVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  string_view sVar36;
  string_view str;
  string_view str_00;
  string_view var;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_03;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_05;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_06;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_07;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_08;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_09;
  Span<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  frames_01;
  PrintOptions opts_00;
  PrintOptions opts_01;
  PrintOptions opts_02;
  PrintOptions opts_03;
  PrintOptions opts_04;
  PrintOptions opts_05;
  PrintOptions opts_06;
  PrintOptions opts_07;
  PrintOptions opts_08;
  PrintOptions opts_09;
  PrintOptions opts_10;
  PrintOptions opts_11;
  PrintOptions opts_12;
  optional<google::protobuf::io::Printer::ValueImpl<false>_> sub;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  annot_records;
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  annot_stack;
  Format fmt;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
  insertion;
  optional<google::protobuf::io::Printer::AnnotationRecord> same_name_record;
  string_view local_250;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  undefined1 local_228 [16];
  string local_218 [8];
  undefined8 local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_208 [3];
  bool local_1d8;
  pointer local_1d0;
  void *local_1c8;
  iterator iStack_1c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *local_1b8;
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  size_t local_188;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_180;
  pointer local_178;
  char *local_170;
  Format local_168;
  undefined1 local_148 [80];
  bool local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_f0;
  char *local_e8;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_e0;
  size_t local_d8;
  ulong local_d0;
  Options *local_c8;
  AnyInvocable<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
  *local_c0;
  char *local_b8;
  LogMessage local_b0;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_a0;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_98;
  size_t *local_90;
  size_t local_88;
  size_t local_80;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_78;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_12;
  
  local_238 = args.len_;
  local_178 = args.ptr_;
  local_188 = this->indent_;
  local_180 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &this->line_start_variables_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_180,
                    (this->line_start_variables_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (opts.use_substitution_map == true) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             *)&this->substitutions_);
  }
  TokenizeFormat(&local_168,this,format,&opts);
  PrintCodegenTrace(this,(_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         opts.loc.
                         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   );
  local_1a8.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = 0;
  local_1b8 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)0x0;
  local_1c8 = (void *)0x0;
  iStack_1c0._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)0x0;
  pcVar22 = extraout_RDX;
  sVar27 = format._M_len;
  local_e8 = format._M_str;
  if (local_168.lines.
      super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_168.lines.
      super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c0 = &this->substitution_listener_;
    local_f0 = &this->paren_depth_to_omit_;
    local_e0 = &this->substitutions_;
    local_c8 = &this->options_;
    local_240 = 0;
    local_230 = 0;
    uVar28 = 0;
    local_d8 = format._M_len;
    do {
      pLVar13 = local_168.lines.
                super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((uVar28 != 0) && ((local_230 & 1) == 0)) &&
         ((local_168.is_raw_string != true ||
          ((local_168.lines.
            super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].chunks.
            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_168.lines.
            super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar28 - 1].chunks.
            super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
            ._M_impl.super__Vector_impl_data._M_finish || ((this->at_start_of_line_ & 1U) == 0))))))
      {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_180,
                          (this->line_start_variables_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,"\n",1);
        this->at_start_of_line_ = true;
        pcVar22 = extraout_RDX_00;
      }
      local_1d0 = pLVar13 + uVar28;
      this->indent_ = local_1d0->indent + local_188;
      pCVar17 = (local_1d0->chunks).
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_d0 = uVar28;
      if ((local_1d0->chunks).
          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
          ._M_impl.super__Vector_impl_data._M_finish == pCVar17) {
        local_230 = 0;
      }
      else {
        local_230 = 0;
        uVar28 = 0;
        do {
          pcVar31 = (char *)pCVar17[uVar28].text._M_len;
          data = pCVar17[uVar28].text._M_str;
          if ((pCVar17[uVar28].is_var & 1U) == 0) {
            WriteRaw(this,data,(size_t)pcVar31);
          }
          else if (pcVar31 == (char *)0x0) {
            WriteRaw(this,&local_c8->variable_delimiter,1);
          }
          else {
            local_250._M_str = data;
            local_250._M_len = (size_t)pcVar31;
            if ((this->substitution_listener_).
                super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
                .
                super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
                .invoker_ !=
                (InvokerType<false,_void,_std::basic_string_view<char>,_google::protobuf::io::Printer::SourceLocation>
                 *)0x0) {
              absl::lts_20250127::internal_any_invocable::
              Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
              ::operator()(&local_c0->
                            super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
                           ,pcVar31,data);
              pcVar22 = extraout_RDX_01;
            }
            ppVar12 = local_1a8.
                      super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppVar1 = local_1a8.
                     super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar9 = opts.strip_raw_string_indentation;
            bVar8 = opts.strip_spaces_around_vars;
            bVar14 = opts.allow_digit_substitutions;
            uVar7 = opts._0_4_;
            if (opts.use_curly_brace_substitutions == true) {
              opts_00.use_annotation_frames = SUB81(pcVar22,0);
              if (((lts_20250127 *)local_250._M_len == (lts_20250127 *)0x0) ||
                 (*local_250._M_str != '{')) {
                if (((lts_20250127 *)local_250._M_len == (lts_20250127 *)0x0) ||
                   (*local_250._M_str != '}')) goto LAB_002dfcfd;
                local_250._M_str = local_250._M_str + 1;
                local_250._M_len = (size_t)(local_250._M_len + -1);
                opts_02.use_curly_brace_substitutions = true;
                opts_02.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                opts_02.checks_are_debug_only = opts.checks_are_debug_only;
                opts_02.use_substitution_map = opts.use_substitution_map;
                opts_02.allow_digit_substitutions = opts.allow_digit_substitutions;
                opts_02.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                opts_02.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                local_228._0_8_ = (_anonymous_namespace_ *)0x1c;
                local_228._8_8_ = "unexpected end of annotation";
                message_01.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                ;
                message_01.ptr_.obj = local_228;
                opts_02.use_annotation_frames = opts_00.use_annotation_frames;
                Validate(local_1a8.
                         super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start !=
                         local_1a8.
                         super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,opts_02,message_01);
                if (ppVar1 != ppVar12) {
                  local_1a8.
                  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first.second =
                       (this->sink_).bytes_written_;
                  pAVar4 = (this->options_).annotation_collector;
                  if (pAVar4 != (AnnotationCollector *)0x0) {
                    (*pAVar4->_vptr_AnnotationCollector[4])
                              (pAVar4,local_1a8.
                                      super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -1);
                  }
                  ppVar1 = local_1a8.
                           super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1;
                  pcVar3 = local_1a8.
                           super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].second._M_dataplus._M_p;
                  paVar18 = &local_1a8.
                             super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].second.field_2;
                  local_1a8.
                  super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar3 != paVar18) {
                    operator_delete(pcVar3,paVar18->_M_allocated_capacity + 1);
                  }
                }
              }
              else {
                plVar29 = (lts_20250127 *)(local_250._M_len + -1);
                local_250._M_str = local_250._M_str + 1;
                local_250._M_len = (size_t)plVar29;
                opts_11.use_curly_brace_substitutions = true;
                opts_11.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                opts_11.checks_are_debug_only = opts.checks_are_debug_only;
                opts_11.use_substitution_map = opts.use_substitution_map;
                opts_11.allow_digit_substitutions = opts.allow_digit_substitutions;
                opts_11.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                opts_11.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                local_228._0_8_ = (_anonymous_namespace_ *)0x1e;
                local_228._8_8_ = "expected single-digit variable";
                message.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                ;
                message.ptr_.obj = local_228;
                opts_00.loc.
                super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                _M_payload.
                super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
                opts_00.checks_are_debug_only = (bool)opts.checks_are_debug_only;
                opts_00.use_substitution_map = (bool)opts.use_substitution_map;
                opts_00.use_curly_brace_substitutions = true;
                opts_00.allow_digit_substitutions = opts.allow_digit_substitutions;
                opts_00.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                opts_00.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                Validate(plVar29 == (lts_20250127 *)0x1,opts_00,message);
                if (plVar29 == (lts_20250127 *)0x1) {
                  cVar15 = *local_250._M_str;
                  local_228._0_8_ = (_anonymous_namespace_ *)0x16;
                  local_228._8_8_ = "expected digit after {";
                  message_00.invoker_ =
                       absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                  ;
                  message_00.ptr_.obj = local_228;
                  opts_01.use_annotation_frames = SUB81(extraout_RDX_02,0);
                  opts_01.loc.
                  super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                       (short)uVar7;
                  opts_01.checks_are_debug_only = (bool)SUB41(uVar7,2);
                  opts_01.use_substitution_map = (bool)SUB41(uVar7,3);
                  opts_01.use_curly_brace_substitutions = true;
                  opts_01.allow_digit_substitutions = bVar14;
                  opts_01.strip_spaces_around_vars = bVar8;
                  opts_01.strip_raw_string_indentation = bVar9;
                  Validate((byte)(cVar15 - 0x30U) < 10,opts_01,message_00);
                  if ((byte)(cVar15 - 0x30U) < 10) {
                    uVar30 = (long)*local_250._M_str - 0x31;
                    opts_11.use_annotation_frames = SUB81(in_R9,0);
                    bVar14 = ValidateIndexLookupInBounds(this,uVar30,local_240,local_238,opts_11);
                    if (bVar14) {
                      bVar14 = uVar30 == local_240;
                      pcVar23 = (char *)CONCAT71((int7)((ulong)this >> 8),bVar14);
                      IndentIfAtStart(this);
                      if (uVar30 < local_238) {
                        local_228._0_8_ = (this->sink_).bytes_written_;
                        local_228._8_8_ = (char *)0x0;
                        local_218 = (string  [8])aaStack_208;
                        pcVar3 = local_178[uVar30]._M_dataplus._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  (local_218,pcVar3,pcVar3 + local_178[uVar30]._M_string_length);
                        std::
                        vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                        ::
                        emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>
                                  ((vector<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>,std::__cxx11::string>>>
                                    *)&local_1a8,
                                   (pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_228);
                        if (local_218 != (string  [8])aaStack_208) {
                          operator_delete((void *)local_218,
                                          (ulong)(aaStack_208[0]._M_allocated_capacity + 1));
                        }
                        local_240 = local_240 + bVar14;
                        goto LAB_002e0508;
                      }
                      PrintImpl();
LAB_002e08ca:
                      PrintImpl();
LAB_002e08cf:
                      std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > __size (which is %zu)",
                                 "basic_string_view::substr",pcVar23,pcVar31);
                    }
                  }
                }
              }
            }
            else {
LAB_002dfcfd:
              pcVar23 = (char *)0x0;
              uVar30 = 0;
              pcVar26 = (char *)0x0;
              pcVar25 = (char *)0x0;
              if (opts.strip_spaces_around_vars == true) {
                sVar36._M_str = pcVar22;
                sVar36._M_len = (size_t)local_250._M_str;
                sVar36 = absl::lts_20250127::StripLeadingAsciiWhitespace
                                   ((lts_20250127 *)local_250._M_len,sVar36);
                pcVar22 = sVar36._M_str;
                uVar30 = sVar36._M_len;
                pcVar26 = pcVar31 + -uVar30;
                if (pcVar31 < pcVar31 + -uVar30) {
                  pcVar26 = pcVar31;
                }
                pcVar23 = pcVar22 + uVar30;
                in_R9 = &absl::lts_20250127::ascii_internal::kPropertyBits;
                pcVar25 = pcVar23;
                if (0 < (long)uVar30 >> 2) {
                  pcVar25 = pcVar22 + ((uint)sVar36._M_len & 3);
                  lVar24 = ((long)uVar30 >> 2) + 1;
                  do {
                    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar23[-1]] & 8
                        ) == 0) goto LAB_002dfe0f;
                    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar23[-2]] & 8
                        ) == 0) {
                      pcVar23 = pcVar23 + -1;
                      goto LAB_002dfe0f;
                    }
                    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar23[-3]] & 8
                        ) == 0) {
                      pcVar23 = pcVar23 + -2;
                      goto LAB_002dfe0f;
                    }
                    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar23[-4]] & 8
                        ) == 0) {
                      pcVar23 = pcVar23 + -3;
                      goto LAB_002dfe0f;
                    }
                    pcVar23 = pcVar23 + -4;
                    lVar24 = lVar24 + -1;
                  } while (1 < lVar24);
                }
                lVar24 = (long)pcVar25 - (long)pcVar22;
                if (lVar24 == 1) {
LAB_002dfdea:
                  pcVar23 = pcVar25;
                  if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar25[-1]] & 8)
                      != 0) {
                    pcVar23 = pcVar22;
                  }
                }
                else if (lVar24 == 2) {
LAB_002dfddc:
                  pcVar23 = pcVar25;
                  if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar25[-1]] & 8)
                      != 0) {
                    pcVar25 = pcVar25 + -1;
                    goto LAB_002dfdea;
                  }
                }
                else {
                  pcVar23 = pcVar22;
                  if ((lVar24 == 3) &&
                     (pcVar23 = pcVar25,
                     ((&absl::lts_20250127::ascii_internal::kPropertyBits)[(byte)pcVar25[-1]] & 8)
                     != 0)) {
                    pcVar25 = pcVar25 + -1;
                    goto LAB_002dfddc;
                  }
                }
LAB_002dfe0f:
                local_250._M_len = (long)pcVar23 - (long)pcVar22;
                if (uVar30 < (ulong)((long)pcVar23 - (long)pcVar22)) {
                  local_250._M_len = uVar30;
                }
                local_250._M_str = pcVar22;
                pcVar23 = pcVar26 + local_250._M_len;
                uVar30 = (long)pcVar31 - (long)pcVar23;
                if (pcVar31 < pcVar23) goto LAB_002e08cf;
                pcVar23 = pcVar23 + (long)data;
                pcVar25 = data;
              }
              bVar35 = opts.use_annotation_frames;
              bVar10 = opts.strip_raw_string_indentation;
              bVar9 = opts.strip_spaces_around_vars;
              bVar8 = opts.allow_digit_substitutions;
              bVar14 = opts.use_curly_brace_substitutions;
              uVar7 = opts._0_4_;
              sVar27 = local_250._M_len;
              opts_08.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
              opts_08.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              opts_08.checks_are_debug_only = opts.checks_are_debug_only;
              opts_08.use_substitution_map = opts.use_substitution_map;
              opts_08.allow_digit_substitutions = opts.allow_digit_substitutions;
              opts_08.strip_spaces_around_vars = opts.strip_spaces_around_vars;
              opts_08.strip_raw_string_indentation = opts.strip_raw_string_indentation;
              local_228._0_8_ = (_anonymous_namespace_ *)0x19;
              local_228._8_8_ = "unexpected empty variable";
              message_02.invoker_ =
                   absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
              ;
              message_02.ptr_.obj = local_228;
              opts_03.use_annotation_frames = SUB81(pcVar22,0);
              opts_03.loc.
              super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                   = (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                     opts.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
              opts_03.checks_are_debug_only = (bool)opts.checks_are_debug_only;
              opts_03.use_substitution_map = (bool)opts.use_substitution_map;
              opts_03.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
              opts_03.allow_digit_substitutions = opts.allow_digit_substitutions;
              opts_03.strip_spaces_around_vars = opts.strip_spaces_around_vars;
              opts_03.strip_raw_string_indentation = opts.strip_raw_string_indentation;
              local_170 = pcVar26;
              local_b8 = pcVar25;
              Validate(local_250._M_len != 0,opts_03,message_02);
              if (sVar27 != 0) {
                if (local_250._M_len < 7) {
                  bVar33 = false;
                }
                else {
                  bVar33 = *(int *)((long)local_250._M_str + 3) == 0x24747261 &&
                           *(int *)local_250._M_str == 0x6174735f;
                }
                if (bVar33 != false) {
                  local_250._M_str = (char *)((long)local_250._M_str + 7);
                  local_250._M_len = local_250._M_len - 7;
                }
                if (local_250._M_len < 5) {
                  bVar34 = false;
                }
                else {
                  bVar34 = (char)*(int *)((long)local_250._M_str + 4) == '$' &&
                           *(int *)local_250._M_str == 0x646e655f;
                }
                piVar20 = (int *)local_250._M_str;
                if (bVar34 != false) {
                  piVar20 = (int *)((long)local_250._M_str + 5);
                  local_250._M_str = (char *)piVar20;
                  local_250._M_len = local_250._M_len - 5;
                }
                sVar27 = local_250._M_len;
                if (((bVar34 | bVar33) & bVar35) == 1) {
                  if (bVar33 == false) {
                    local_230 = local_230 & 0xff;
                    if ((long)(local_1d0->chunks).
                              super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_1d0->chunks).
                              super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                              ._M_impl.super__Vector_impl_data._M_start == 0x18) {
                      local_230 = 1;
                    }
                    ppVar2 = iStack_1c0._M_current + -1;
                    __n = (_anonymous_namespace_ *)iStack_1c0._M_current[-1].first._M_len;
                    pcVar22 = iStack_1c0._M_current[-1].first._M_str;
                    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)iStack_1c0._M_current[-1].second;
                    iStack_1c0._M_current = ppVar2;
                    if (__n == (_anonymous_namespace_ *)local_250._M_len) {
                      if (__n == (_anonymous_namespace_ *)0x0) {
                        bVar35 = true;
                      }
                      else {
                        iVar16 = bcmp(pcVar22,local_250._M_str,(size_t)__n);
                        bVar35 = iVar16 == 0;
                        piVar20 = extraout_RDX_10;
                      }
                    }
                    else {
                      bVar35 = false;
                    }
                    local_210 = local_250._M_len;
                    aaStack_208[0]._M_allocated_capacity = local_250._M_str;
                    message_06.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
                    ;
                    message_06.ptr_.obj = local_228;
                    opts_07.use_annotation_frames = SUB81(piVar20,0);
                    opts_07.loc.
                    super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         (short)uVar7;
                    opts_07.checks_are_debug_only = (bool)SUB41(uVar7,2);
                    opts_07.use_substitution_map = (bool)SUB41(uVar7,3);
                    opts_07.use_curly_brace_substitutions = bVar14;
                    opts_07.allow_digit_substitutions = bVar8;
                    opts_07.strip_spaces_around_vars = bVar9;
                    opts_07.strip_raw_string_indentation = bVar10;
                    local_228._0_8_ = __n;
                    local_228._8_8_ = pcVar22;
                    local_218 = (string  [8])paVar18;
                    Validate(bVar35,opts_07,message_06);
                    if (bVar35 != false) {
                      pfVar6 = (this->annotation_lookups_).
                               super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      frames_00.len_ =
                           (long)(this->annotation_lookups_).
                                 super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar6 >> 5;
                      frames_00.ptr_ = pfVar6;
                      anon_unknown_4::
                      LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
                                ((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                                 local_228,local_250,frames_00);
                      uVar11 = aaStack_208[2]._0_1_;
                      local_148._0_8_ = local_250._M_len;
                      local_148._8_8_ = local_250._M_str;
                      message_07.invoker_ =
                           absl::lts_20250127::functional_internal::
                           InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__2,std::__cxx11::string>
                      ;
                      message_07.ptr_.obj = local_148;
                      opts_08.use_annotation_frames = SUB81(extraout_RDX_11,0);
                      Validate((bool)aaStack_208[2]._0_1_,opts_08,message_07);
                      if (((bool)uVar11 != false) &&
                         (pAVar4 = (this->options_).annotation_collector,
                         pAVar4 != (AnnotationCollector *)0x0)) {
                        in_R9 = aaStack_208[1]._8_8_;
                        (*pAVar4->_vptr_AnnotationCollector[3])
                                  (pAVar4,paVar18,(this->sink_).bytes_written_,&local_210,local_228)
                        ;
                      }
                      if (aaStack_208[2]._0_1_ == '\x01') {
                        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                        ::_M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                      *)local_228);
                      }
                    }
                  }
                  else {
                    IndentIfAtStart(this);
                    local_218 = (string  [8])(this->sink_).bytes_written_;
                    local_228._0_8_ = local_250._M_len;
                    local_228._8_8_ = local_250._M_str;
                    if (iStack_1c0._M_current == local_1b8) {
                      std::
                      vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>>
                      ::
                      _M_realloc_insert<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>
                                ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>>
                                  *)&local_1c8,iStack_1c0,
                                 (pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                                  *)local_228);
                    }
                    else {
                      (iStack_1c0._M_current)->second = (unsigned_long)local_218;
                      ((iStack_1c0._M_current)->first)._M_len = local_250._M_len;
                      ((iStack_1c0._M_current)->first)._M_str = local_250._M_str;
                      iStack_1c0._M_current = iStack_1c0._M_current + 1;
                    }
                    uVar28 = uVar28 + 1;
                    pCVar17 = (local_1d0->chunks).
                              super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (uVar28 < (ulong)(((long)(local_1d0->chunks).
                                                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pCVar17 >> 3) * -0x5555555555555555)) {
                      uVar30 = ~pCVar17[uVar28].text._M_len;
                      pcVar22 = pCVar17[uVar28].text._M_str + -1;
                      do {
                        if (uVar30 == 0xffffffffffffffff) {
                          bVar14 = false;
                        }
                        else {
                          bVar14 = pcVar22[1] == ' ';
                        }
                        uVar30 = uVar30 + 1;
                        pcVar22 = pcVar22 + 1;
                      } while (bVar14);
                      WriteRaw(this,pcVar22,-uVar30);
                    }
                  }
                }
                else {
                  local_1d8 = false;
                  local_78._M_engaged = false;
                  if ((opts.allow_digit_substitutions == true) &&
                     ((byte)(*local_250._M_str - 0x30U) < 10)) {
                    local_148._0_8_ = 0x1e;
                    local_148._8_8_ = "expected single-digit variable";
                    message_03.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                    ;
                    message_03.ptr_.obj = local_148;
                    opts_04.use_annotation_frames = SUB81(piVar20,0);
                    opts_04.loc.
                    super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         (short)uVar7;
                    opts_04.checks_are_debug_only = (bool)SUB41(uVar7,2);
                    opts_04.use_substitution_map = (bool)SUB41(uVar7,3);
                    opts_04.use_curly_brace_substitutions = bVar14;
                    opts_04.allow_digit_substitutions = bVar8;
                    opts_04.strip_spaces_around_vars = bVar9;
                    opts_04.strip_raw_string_indentation = bVar10;
                    Validate((_anonymous_namespace_ *)local_250._M_len ==
                             (_anonymous_namespace_ *)0x1,opts_04,message_03);
                    if ((_anonymous_namespace_ *)sVar27 == (_anonymous_namespace_ *)0x1) {
                      index = (long)*local_250._M_str - 0x31;
                      opts_12.use_annotation_frames = SUB81(in_R9,0);
                      opts_12.loc.
                      super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                            )(_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                              )(short)uVar7;
                      opts_12.checks_are_debug_only = (bool)SUB41(uVar7,2);
                      opts_12.use_substitution_map = (bool)SUB41(uVar7,3);
                      opts_12.use_curly_brace_substitutions = bVar14;
                      opts_12.allow_digit_substitutions = bVar8;
                      opts_12.strip_spaces_around_vars = bVar9;
                      opts_12.strip_raw_string_indentation = bVar10;
                      bVar14 = ValidateIndexLookupInBounds(this,index,local_240,local_238,opts_12);
                      pcVar31 = (char *)(CONCAT71(extraout_var,bVar14) & 0xffffffff);
                      uVar21 = extraout_RDX_03;
                      if (bVar14) {
                        if (local_238 <= index) goto LAB_002e08ca;
                        bVar14 = index == local_240;
                        std::optional<google::protobuf::io::Printer::ValueImpl<false>>::operator=
                                  ((optional<google::protobuf::io::Printer::ValueImpl<false>> *)
                                   local_228,local_178 + index);
                        local_240 = local_240 + bVar14;
                        uVar21 = extraout_RDX_04;
                      }
                      if ((char)pcVar31 != '\0') goto LAB_002e0131;
                    }
                  }
                  else {
                    pfVar5 = (this->var_lookups_).
                             super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    frames_01.ptr_ =
                         (pointer)((long)(this->var_lookups_).
                                         super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar5
                                  >> 5);
                    var._M_str = (char *)pfVar5;
                    var._M_len = (size_t)local_250._M_str;
                    frames_01.len_._0_4_ = SUB84(in_R9,0);
                    frames_01.len_._4_1_ = SUB81(in_R9,4);
                    frames_01.len_._5_3_ = SUB83(in_R9,5);
                    io::(anonymous_namespace)::
                    LookupInFrameStack<google::protobuf::io::Printer::ValueImpl<false>>
                              ((optional<google::protobuf::io::Printer::ValueImpl<false>_> *)
                               local_148,(_anonymous_namespace_ *)local_250._M_len,var,frames_01);
                    std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::
                    _M_move_assign((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                    *)local_228,
                                   (_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                    *)local_148);
                    uVar21 = extraout_RDX_05;
                    if (local_f8 == true) {
                      std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                      ::_M_destroy((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                    *)local_148);
                      uVar21 = extraout_RDX_06;
                    }
                    if ((bVar35 & 1U) != 0) {
                      pfVar6 = (this->annotation_lookups_).
                               super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      frames.len_ = (long)(this->annotation_lookups_).
                                          super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar6
                                    >> 5;
                      frames.ptr_ = pfVar6;
                      anon_unknown_4::
                      LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
                                ((optional<google::protobuf::io::Printer::AnnotationRecord> *)
                                 local_148,local_250,frames);
                      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                      _M_move_assign(&local_78,
                                     (_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                      *)local_148);
                      uVar21 = extraout_RDX_07;
                      if (local_148[0x40] == '\x01') {
                        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                        ::_M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                      *)local_148);
                        uVar21 = extraout_RDX_08;
                      }
                    }
LAB_002e0131:
                    bVar14 = local_1d8;
                    opts_06.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
                    opts_06.loc.
                    super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                         opts.loc.
                         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                    ;
                    opts_06.checks_are_debug_only = opts.checks_are_debug_only;
                    opts_06.use_substitution_map = opts.use_substitution_map;
                    opts_06.allow_digit_substitutions = opts.allow_digit_substitutions;
                    opts_06.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                    opts_06.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                    local_148._0_8_ = local_250._M_len;
                    local_148._8_8_ = local_250._M_str;
                    message_04.invoker_ =
                         absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__3,std::__cxx11::string>
                    ;
                    message_04.ptr_.obj = local_148;
                    opts_05.use_annotation_frames = SUB81(uVar21,0);
                    opts_05.loc.
                    super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
                         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
                         opts.loc.
                         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>
                    ;
                    opts_05.checks_are_debug_only = (bool)opts.checks_are_debug_only;
                    opts_05.use_substitution_map = (bool)opts.use_substitution_map;
                    opts_05.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
                    opts_05.allow_digit_substitutions = opts.allow_digit_substitutions;
                    opts_05.strip_spaces_around_vars = opts.strip_spaces_around_vars;
                    opts_05.strip_raw_string_indentation = opts.strip_raw_string_indentation;
                    Validate(local_1d8,opts_05,message_04);
                    if (bVar14 != false) {
                      if (aaStack_208[0]._M_local_buf[0] == '\0') {
                        sVar27 = (this->sink_).bytes_written_;
                        if ((this->at_start_of_line_ == true) &&
                           ((_anonymous_namespace_ *)local_228._0_8_ == (_anonymous_namespace_ *)0x0
                           )) {
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                                    (local_180,&local_250);
                        }
                        sVar32 = sVar27;
                        if ((_anonymous_namespace_ *)local_228._0_8_ != (_anonymous_namespace_ *)0x0
                           ) {
                          WriteRaw(this,local_b8,(size_t)local_170);
                          WriteRaw(this,(char *)local_228._8_8_,local_228._0_8_);
                          sVar27 = (this->sink_).bytes_written_;
                          sVar32 = sVar27 - local_228._0_8_;
                          WriteRaw(this,pcVar23,uVar30);
                        }
                      }
                      else {
                        if (aaStack_208[0]._M_local_buf[0] != '\x01') {
                          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                    ((LogMessageFatal *)local_148,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                                     ,0x2ea,"fnc != nullptr");
                          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                                    ((LogMessageFatal *)local_148);
                        }
                        local_170 = (char *)((ulong)local_170 | uVar30);
                        local_148._0_8_ = 0x40;
                        local_148._8_8_ =
                             "substitution that resolves to callback cannot contain whitespace";
                        message_05.invoker_ =
                             absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::io::Printer::Validate(bool,google::protobuf::io::Printer::PrintOptions,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
                        ;
                        message_05.ptr_.obj = local_148;
                        opts_06.use_annotation_frames = SUB81(extraout_RDX_09,0);
                        Validate(local_170 == (char *)0x0,opts_06,message_05);
                        if (local_218 == (string  [8])0x0) {
                          std::__throw_bad_function_call();
                        }
                        sVar32 = (this->sink_).bytes_written_;
                        cVar15 = (*(code *)local_210)();
                        if (cVar15 == '\0') {
                          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                    ((LogMessageFatal *)&local_b0,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                                     ,0x2f1,"(*fnc)()");
                          str._M_str = "recursive call encountered while evaluating \"";
                          str._M_len = 0x2d;
                          absl::lts_20250127::log_internal::LogMessage::
                          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                                    (&local_b0,str);
                          this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                              (&local_b0,local_250);
                          str_00._M_str = "\"";
                          str_00._M_len = 1;
                          absl::lts_20250127::log_internal::LogMessage::
                          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                                    (this_00,str_00);
                          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                                    ((LogMessageFatal *)&local_b0);
                        }
                        sVar27 = (this->sink_).bytes_written_;
                      }
                      if ((sVar32 == sVar27) && ((bool)aaStack_208[2]._8_1_ == true)) {
                        local_148._0_8_ = this->paren_depth_ + 1;
                        __position._M_current =
                             (this->paren_depth_to_omit_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        if (__position._M_current ==
                            (this->paren_depth_to_omit_).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                          _M_realloc_insert<unsigned_long>
                                    (local_f0,__position,(unsigned_long *)local_148);
                        }
                        else {
                          *__position._M_current = local_148._0_8_;
                          (this->paren_depth_to_omit_).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = __position._M_current + 1;
                        }
                      }
                      if (aaStack_208[1]._0_8_ != 0) {
                        uVar30 = uVar28 + 1;
                        pCVar17 = (local_1d0->chunks).
                                  super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if ((uVar30 < (ulong)(((long)(local_1d0->chunks).
                                                                                                          
                                                  super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)pCVar17 >> 3) * -0x5555555555555555)) &&
                           (pCVar17[uVar30].is_var == false)) {
                          size = pCVar17[uVar30].text._M_len;
                          pcVar22 = pCVar17[uVar30].text._M_str;
                          lVar24 = 0;
                          do {
                            if (size == 0) {
                              bVar14 = false;
                            }
                            else {
                              bVar14 = *pcVar22 == *(char *)(aaStack_208[0]._8_8_ + lVar24);
                            }
                            size = size - bVar14;
                            pcVar22 = pcVar22 + bVar14;
                          } while ((bVar14 == false) &&
                                  (bVar14 = aaStack_208[1]._0_8_ - 1 != lVar24, lVar24 = lVar24 + 1,
                                  bVar14));
                          WriteRaw(this,pcVar22,size);
                          uVar28 = uVar30;
                        }
                      }
                      if ((local_78._M_engaged == true) &&
                         (pAVar4 = (this->options_).annotation_collector,
                         pAVar4 != (AnnotationCollector *)0x0)) {
                        in_R9 = local_78._M_payload._M_value.semantic.
                                super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                        ;
                        (*pAVar4->_vptr_AnnotationCollector[3])
                                  (pAVar4,sVar32,sVar27,
                                   (undefined1 *)((long)&local_78._M_payload + 0x18),&local_78);
                      }
                      if (opts.use_substitution_map == true) {
                        local_a0 = local_e0;
                        local_98._M_head_impl = &local_250;
                        local_90 = &local_88;
                        in_R9 = &local_90;
                        local_88 = sVar32;
                        local_80 = sVar27;
                        absl::lts_20250127::container_internal::
                        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                        ::EmplaceDecomposable::operator()
                                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
                                    *)local_148,&local_a0,local_98._M_head_impl,
                                   (piecewise_construct_t *)&std::piecewise_construct,
                                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&> *
                                   )&local_98,
                                   (tuple<std::pair<unsigned_long,_unsigned_long>_&&> *)in_R9);
                        if (local_148[0x10] == '\0') {
                          prVar19 = absl::lts_20250127::container_internal::
                                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                                    ::iterator::operator->((iterator *)local_148);
                          (prVar19->second).first = 1;
                          (prVar19->second).second = 0;
                        }
                      }
                    }
                  }
                  if (local_78._M_engaged == true) {
                    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                    _M_destroy(&local_78);
                  }
                  if (local_1d8 == true) {
                    std::_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>::
                    _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::ValueImpl<false>_>
                                *)local_228);
                  }
                }
              }
            }
          }
LAB_002e0508:
          uVar28 = uVar28 + 1;
          pCVar17 = (local_1d0->chunks).
                    super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar22 = (char *)0xaaaaaaaaaaaaaaab;
        } while (uVar28 < (ulong)(((long)(local_1d0->chunks).
                                         super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar17
                                  >> 3) * -0x5555555555555555));
      }
      uVar28 = local_d0 + 1;
      sVar27 = local_d8;
    } while (uVar28 < (ulong)((long)local_168.lines.
                                    super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_168.lines.
                                    super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pcVar31 = local_e8;
  opts_10.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
  opts_10.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
  opts_10.checks_are_debug_only = opts.checks_are_debug_only;
  opts_10.use_substitution_map = opts.use_substitution_map;
  opts_10.allow_digit_substitutions = opts.allow_digit_substitutions;
  opts_10.strip_spaces_around_vars = opts.strip_spaces_around_vars;
  opts_10.strip_raw_string_indentation = opts.strip_raw_string_indentation;
  local_228._8_8_ = local_e8;
  message_08.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__4,std::__cxx11::string>
  ;
  message_08.ptr_.obj = local_228;
  opts_09.use_annotation_frames = SUB81(pcVar22,0);
  opts_09.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>;
  opts_09.checks_are_debug_only = (bool)opts.checks_are_debug_only;
  opts_09.use_substitution_map = (bool)opts.use_substitution_map;
  opts_09.use_curly_brace_substitutions = opts.use_curly_brace_substitutions;
  opts_09.allow_digit_substitutions = opts.allow_digit_substitutions;
  opts_09.strip_spaces_around_vars = opts.strip_spaces_around_vars;
  opts_09.strip_raw_string_indentation = opts.strip_raw_string_indentation;
  local_228._0_8_ = sVar27;
  Validate(local_240 == local_238,opts_09,message_08);
  local_218 = (string  [8])pcVar31;
  message_09.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__5,std::__cxx11::string>
  ;
  message_09.ptr_.obj = local_228;
  opts_10.use_annotation_frames = SUB81(extraout_RDX_12,0);
  local_228._0_8_ = this;
  local_228._8_8_ = sVar27;
  Validate(local_1a8.
           super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_1a8.
           super__Vector_base<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish,opts_10,message_09);
  if ((local_168.is_raw_string == true) && (this->at_start_of_line_ == false)) {
    WriteRaw(this,"\n",1);
    this->at_start_of_line_ = true;
  }
  if (local_1c8 != (void *)0x0) {
    operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
  }
  std::
  vector<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::pair<unsigned_long,_unsigned_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1a8);
  std::
  vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
  ::~vector(&local_168.lines);
  this->indent_ = local_188;
  return;
}

Assistant:

void Printer::PrintImpl(absl::string_view format,
                        absl::Span<const std::string> args, PrintOptions opts) {
  // Inside of this function, we set indentation as we print new lines from
  // the format string. No matter how we exit this function, we should fix up
  // the indent to what it was before we entered; a cleanup makes it easy to
  // avoid this mistake.
  size_t original_indent = indent_;
  auto unindent =
      absl::MakeCleanup([this, original_indent] { indent_ = original_indent; });

  absl::string_view original = format;

  line_start_variables_.clear();

  if (opts.use_substitution_map) {
    substitutions_.clear();
  }

  auto fmt = TokenizeFormat(format, opts);
  PrintCodegenTrace(opts.loc);

  size_t arg_index = 0;
  bool skip_next_newline = false;
  std::vector<AnnotationCollector::Annotation> annot_stack;
  std::vector<std::pair<absl::string_view, size_t>> annot_records;
  for (size_t line_idx = 0; line_idx < fmt.lines.size(); ++line_idx) {
    const auto& line = fmt.lines[line_idx];

    // We only print a newline for lines that follow the first; a loop iteration
    // can also hint that we should not emit another newline through the
    // `skip_next_newline` variable.
    //
    // We also assume that double newlines are undesirable, so we
    // do not emit a newline if we are at the beginning of a line, *unless* the
    // previous format line is actually empty. This behavior is specific to
    // raw strings.
    if (line_idx > 0) {
      bool prev_was_empty = fmt.lines[line_idx - 1].chunks.empty();
      bool should_skip_newline =
          skip_next_newline ||
          (fmt.is_raw_string && (at_start_of_line_ && !prev_was_empty));
      if (!should_skip_newline) {
        line_start_variables_.clear();
        sink_.Write("\n");
        at_start_of_line_ = true;
      }
    }
    skip_next_newline = false;

    indent_ = original_indent + line.indent;

    for (size_t chunk_idx = 0; chunk_idx < line.chunks.size(); ++chunk_idx) {
      auto chunk = line.chunks[chunk_idx];

      if (!chunk.is_var) {
        PrintRaw(chunk.text);
        continue;
      }

      if (chunk.text.empty()) {
        // `$$` is an escape for just `$`.
        WriteRaw(&options_.variable_delimiter, 1);
        continue;
      }

      // If we get this far, we can conclude the chunk is a substitution
      // variable; we rename the `chunk` variable to make this clear below.
      absl::string_view var = chunk.text;
      if (substitution_listener_ != nullptr) {
        substitution_listener_(var, opts.loc.value_or(SourceLocation()));
      }
      if (opts.use_curly_brace_substitutions &&
          absl::ConsumePrefix(&var, "{")) {
        if (!Validate(var.size() == 1u, opts,
                      "expected single-digit variable")) {
          continue;
        }

        if (!Validate(absl::ascii_isdigit(var[0]), opts,
                      "expected digit after {")) {
          continue;
        }

        size_t idx = var[0] - '1';
        if (!ValidateIndexLookupInBounds(idx, arg_index, args.size(), opts)) {
          continue;
        }

        if (idx == arg_index) {
          ++arg_index;
        }

        IndentIfAtStart();
        annot_stack.push_back({{sink_.bytes_written(), 0}, args[idx]});
        continue;
      }

      if (opts.use_curly_brace_substitutions &&
          absl::ConsumePrefix(&var, "}")) {
        // The rest of var is actually ignored, and this is apparently
        // public API now. Oops?
        if (!Validate(!annot_stack.empty(), opts,
                      "unexpected end of annotation")) {
          continue;
        }

        annot_stack.back().first.second = sink_.bytes_written();
        if (options_.annotation_collector != nullptr) {
          options_.annotation_collector->AddAnnotationNew(annot_stack.back());
        }
        annot_stack.pop_back();
        continue;
      }

      absl::string_view prefix, suffix;
      if (opts.strip_spaces_around_vars) {
        var = absl::StripLeadingAsciiWhitespace(var);
        prefix = chunk.text.substr(0, chunk.text.size() - var.size());
        var = absl::StripTrailingAsciiWhitespace(var);
        suffix = chunk.text.substr(prefix.size() + var.size());
      }

      if (!Validate(!var.empty(), opts, "unexpected empty variable")) {
        continue;
      }

      bool is_start = absl::ConsumePrefix(&var, "_start$");
      bool is_end = absl::ConsumePrefix(&var, "_end$");
      if (opts.use_annotation_frames && (is_start || is_end)) {
        if (is_start) {
          IndentIfAtStart();
          annot_records.push_back({var, sink_.bytes_written()});

          // Skip all whitespace immediately after a _start.
          ++chunk_idx;
          if (chunk_idx < line.chunks.size()) {
            absl::string_view text = line.chunks[chunk_idx].text;
            while (absl::ConsumePrefix(&text, " ")) {
            }
            PrintRaw(text);
          }
        } else {
          // If a line consisted *only* of an _end, this will likely result in
          // a blank line if we do not zap the newline after it, so we do that
          // here.
          if (line.chunks.size() == 1) {
            skip_next_newline = true;
          }

          auto record_var = annot_records.back();
          annot_records.pop_back();

          if (!Validate(record_var.first == var, opts, [record_var, var] {
                return absl::StrFormat(
                    "_start and _end variables must match, but got %s and %s, "
                    "respectively",
                    record_var.first, var);
              })) {
            continue;
          }

          absl::optional<AnnotationRecord> record =
              LookupInFrameStack(var, absl::MakeSpan(annotation_lookups_));

          if (!Validate(record.has_value(), opts, [var] {
                return absl::StrCat("undefined annotation variable: \"",
                                    absl::CHexEscape(var), "\"");
              })) {
            continue;
          }

          if (options_.annotation_collector != nullptr) {
            options_.annotation_collector->AddAnnotation(
                record_var.second, sink_.bytes_written(), record->file_path,
                record->path, record->semantic);
          }
        }

        continue;
      }

      absl::optional<ValueView> sub;
      absl::optional<AnnotationRecord> same_name_record;
      if (opts.allow_digit_substitutions && absl::ascii_isdigit(var[0])) {
        if (!Validate(var.size() == 1u, opts,
                      "expected single-digit variable")) {
          continue;
        }

        size_t idx = var[0] - '1';
        if (!ValidateIndexLookupInBounds(idx, arg_index, args.size(), opts)) {
          continue;
        }
        if (idx == arg_index) {
          ++arg_index;
        }
        sub = args[idx];
      } else {
        sub = LookupInFrameStack(var, absl::MakeSpan(var_lookups_));

        if (opts.use_annotation_frames) {
          same_name_record =
              LookupInFrameStack(var, absl::MakeSpan(annotation_lookups_));
        }
      }

      // By returning here in case of empty we also skip possible spaces inside
      // the $...$, i.e. "void$ dllexpor$ f();" -> "void f();" in the empty
      // case.
      if (!Validate(sub.has_value(), opts, [var] {
            return absl::StrCat("undefined variable: \"", absl::CHexEscape(var),
                                "\"");
          })) {
        continue;
      }

      size_t range_start = sink_.bytes_written();
      size_t range_end = sink_.bytes_written();

      if (const absl::string_view* str = sub->AsString()) {
        if (at_start_of_line_ && str->empty()) {
          line_start_variables_.emplace_back(var);
        }

        if (!str->empty()) {
          // If `sub` is empty, we do not print the spaces around it.
          PrintRaw(prefix);
          PrintRaw(*str);
          range_end = sink_.bytes_written();
          range_start = range_end - str->size();
          PrintRaw(suffix);
        }
      } else {
        const ValueView::Callback* fnc = sub->AsCallback();
        ABSL_CHECK(fnc != nullptr);

        Validate(
            prefix.empty() && suffix.empty(), opts,
            "substitution that resolves to callback cannot contain whitespace");

        range_start = sink_.bytes_written();
        ABSL_CHECK((*fnc)())
            << "recursive call encountered while evaluating \"" << var << "\"";
        range_end = sink_.bytes_written();
      }

      if (range_start == range_end && sub->consume_parens_if_empty) {
        paren_depth_to_omit_.push_back(paren_depth_ + 1);
      }

      // If we just evaluated a value which specifies end-of-line consume-after
      // characters, and we're at the start of a line, that means we finished
      // with a newline.
      //
      // We trim a single end-of-line `consume_after` character in this case.
      //
      // This helps callback formatting "work as expected" with respect to forms
      // like
      //
      //   class Foo {
      //     $methods$;
      //   };
      //
      // Without this post-processing, it would turn into
      //
      //   class Foo {
      //     void Bar() {};
      //   };
      //
      // in many cases. Without the `;`, clang-format may format the template
      // incorrectly.
      auto next_idx = chunk_idx + 1;
      if (!sub->consume_after.empty() && next_idx < line.chunks.size() &&
          !line.chunks[next_idx].is_var) {
        chunk_idx = next_idx;

        absl::string_view text = line.chunks[chunk_idx].text;
        for (char c : sub->consume_after) {
          if (absl::ConsumePrefix(&text, absl::string_view(&c, 1))) {
            break;
          }
        }

        PrintRaw(text);
      }

      if (same_name_record.has_value() &&
          options_.annotation_collector != nullptr) {
        options_.annotation_collector->AddAnnotation(
            range_start, range_end, same_name_record->file_path,
            same_name_record->path, same_name_record->semantic);
      }

      if (opts.use_substitution_map) {
        auto insertion =
            substitutions_.emplace(var, std::make_pair(range_start, range_end));

        if (!insertion.second) {
          // This variable was used multiple times.
          // Make its span have negative length so
          // we can detect it if it gets used in an
          // annotation.
          insertion.first->second = {1, 0};
        }
      }
    }
  }

  Validate(arg_index == args.size(), opts,
           [original] { return absl::StrCat("unused args: ", original); });
  Validate(annot_stack.empty(), opts, [this, original] {
    return absl::StrFormat(
        "annotation range was not closed; expected %c}%c: %s",
        options_.variable_delimiter, options_.variable_delimiter, original);
  });

  // For multiline raw strings, we always make sure to end on a newline.
  if (fmt.is_raw_string && !at_start_of_line_) {
    PrintRaw("\n");
    at_start_of_line_ = true;
  }
}